

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O1

TapScriptInfoStruct *
cfd::js::api::AddressStructApi::GetTapScriptTreeFromString
          (TapScriptInfoStruct *__return_storage_ptr__,TapScriptFromStringRequestStruct *request)

{
  string *in_R8;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  _Any_data local_218;
  undefined1 local_208 [16];
  TapScriptInfoStruct local_1f8;
  
  TapScriptInfoStruct::TapScriptInfoStruct(__return_storage_ptr__);
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = 0;
  local_228._8_8_ =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:294:20)>
       ::_M_invoke;
  local_228._0_8_ =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:294:20)>
       ::_M_manager;
  local_218._M_unused._M_object = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"GetTapScriptTreeFromString","");
  ExecuteStructApi<cfd::js::api::TapScriptFromStringRequestStruct,cfd::js::api::TapScriptInfoStruct>
            (&local_1f8,(api *)request,(TapScriptFromStringRequestStruct *)local_238,
             (function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
              *)&local_218,in_R8);
  TapScriptInfoStruct::operator=(__return_storage_ptr__,&local_1f8);
  TapScriptInfoStruct::~TapScriptInfoStruct(&local_1f8);
  if ((undefined1 *)local_218._M_unused._0_8_ != local_208) {
    operator_delete(local_218._M_unused._M_object);
  }
  if ((code *)local_228._0_8_ != (code *)0x0) {
    (*(code *)local_228._0_8_)(local_238,local_238,3);
  }
  return __return_storage_ptr__;
}

Assistant:

TapScriptInfoStruct AddressStructApi::GetTapScriptTreeFromString(
    const TapScriptFromStringRequestStruct& request) {
  auto call_func = [](const TapScriptFromStringRequestStruct& request)
      -> TapScriptInfoStruct {  // NOLINT
    NetType net_type = ConvertNetType(request.network);
    AddressFactory api(net_type);
    return AddressApiBase::GetTapScriptTreeFromString(request, &api);
  };

  TapScriptInfoStruct result;
  result =
      ExecuteStructApi<TapScriptFromStringRequestStruct, TapScriptInfoStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}